

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QWidget::repaint(QWidget *this)

{
  QWidgetData *pQVar1;
  undefined1 auVar2 [16];
  
  pQVar1 = this->data;
  auVar2._4_4_ = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  auVar2._0_4_ = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  auVar2._8_8_ = 0;
  QWidgetPrivate::repaint<QRect>(*(QWidgetPrivate **)&this->field_0x8,(QRect)(auVar2 << 0x40));
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }